

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

bool __thiscall duckdb::DBConfig::HasArrowExtension(DBConfig *this,LogicalType *type)

{
  pthread_mutex_t *__mutex;
  pointer pAVar1;
  mapped_type *pmVar2;
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  *this_00;
  bool bVar3;
  TypeInfo type_info;
  TypeInfo TStack_48;
  
  this_00 = &this->arrow_extensions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(this_00);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  TypeInfo::TypeInfo(&TStack_48,type);
  pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
           ::operator->(this_00);
  pmVar2 = ::std::__detail::
           _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&pAVar1->type_to_info,&TStack_48);
  bVar3 = true;
  if ((pmVar2->
      super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>)
      .
      super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pmVar2->
      super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>)
      .
      super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TStack_48.type = ANY;
    pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pmVar2 = ::std::__detail::
             _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar1->type_to_info,&TStack_48);
    bVar3 = (pmVar2->
            super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
            ).
            super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pmVar2->
            super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
            ).
            super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  ::std::__cxx11::string::~string((string *)&TStack_48);
  pthread_mutex_unlock(__mutex);
  return bVar3;
}

Assistant:

bool DBConfig::HasArrowExtension(const LogicalType &type) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	TypeInfo type_info(type);
	if (!arrow_extensions->type_to_info[type_info].empty()) {
		return true;
	}
	type_info.type = LogicalTypeId::ANY;
	return !arrow_extensions->type_to_info[type_info].empty();
}